

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_strand.hpp
# Opt level: O1

void __thiscall asio::io_context::strand::strand(strand *this,io_context *io_context)

{
  strand_service *this_00;
  key local_18;
  
  local_18.type_info_ = (type_info *)&detail::typeid_wrapper<asio::detail::strand_service>::typeinfo
  ;
  local_18.id_ = (id *)0x0;
  this_00 = (strand_service *)
            detail::service_registry::do_use_service
                      ((io_context->super_execution_context).service_registry_,&local_18,
                       detail::service_registry::
                       create<asio::detail::strand_service,asio::io_context>,io_context);
  this->service_ = this_00;
  detail::strand_service::construct(this_00,&this->impl_);
  return;
}

Assistant:

explicit strand(asio::io_context& io_context)
    : service_(asio::use_service<
        asio::detail::strand_service>(io_context))
  {
    service_.construct(impl_);
  }